

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpMinus::operator()
          (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
           *__return_storage_ptr__,UnaryOpMinus *this,
          vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
          *u,int param_2)

{
  size_type sVar1;
  ulong uVar2;
  DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *this_00;
  Array<double,_1,1,0,_1,1> *this_01;
  NegativeReturnType local_68;
  int local_58;
  int i;
  allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_> local_41;
  undefined1 local_40 [8];
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  result;
  int param_2_local;
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *u_local;
  UnaryOpMinus *this_local;
  
  result.
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = param_2;
  sVar1 = std::
          vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(u);
  std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::allocator(&local_41);
  std::
  vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
            *)local_40,sVar1,&local_41);
  std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    uVar2 = (ulong)local_58;
    sVar1 = std::
            vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(u);
    if (sVar1 <= uVar2) break;
    this_00 = (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)
              std::
              vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](u,(long)local_58);
    Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator-(&local_68,this_00);
    this_01 = (Array<double,_1,1,0,_1,1> *)
              std::
              vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                            *)local_40,(long)local_58);
    Eigen::Array<double,-1,1,0,-1,1>::operator=
              (this_01,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_68);
    local_58 = local_58 + 1;
  }
  std::
  vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(__return_storage_ptr__,
           (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
            *)local_40);
  std::
  vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Array<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    if constexpr (R == 0 || C == 0) {
      // result array is empty
      return u;
    }
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {
      // array size is known at compile time
      Eigen::Map<const Eigen::Array<S, 1, Eigen::Dynamic>> um(&u[0](0, 0), 1,
                                                              u.size() * R * C);
      std::vector<Eigen::Array<S, R, C, O, MR, MC>> result(u.size());
      Eigen::Map<Eigen::Array<S, 1, Eigen::Dynamic>> rm(&result[0](0, 0), 1,
                                                        u.size() * R * C);
      rm = -um;
      return result;
    } else {
      // array size is dynamic
      std::vector<Eigen::Array<S, R, C, O, MR, MC>> result(u.size());
      for (int i = 0; i < u.size(); ++i) {
        result[i] = -u[i];
      }
      return result;
    }
  }